

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

int valid_profile(char *profile)

{
  undefined4 uVar1;
  MOJOSHADER_glContext *pMVar2;
  int iVar3;
  
  pMVar2 = ctx;
  if (ctx->have_core_opengl == 0) {
    return 0;
  }
  if (profile == (char *)0x0) {
    builtin_strncpy(error_buffer + 8,"file",5);
    builtin_strncpy(error_buffer,"NULL pro",8);
  }
  else {
    iVar3 = strcmp(profile,"arb1");
    if (iVar3 == 0) {
      if (pMVar2->have_GL_ARB_vertex_program == 0) {
        builtin_strncpy(error_buffer + 0x30,"tex_program",0xc);
        builtin_strncpy(error_buffer + 0x10,"LE_ARB1 profile needs GL_ARB_ver",0x20);
      }
      else {
        if (pMVar2->have_GL_ARB_fragment_program != 0) {
          return 1;
        }
        builtin_strncpy(error_buffer + 0x30,"gment_program",0xe);
        builtin_strncpy(error_buffer + 0x10,"LE_ARB1 profile needs GL_ARB_fra",0x20);
      }
    }
    else {
      iVar3 = strcmp(profile,"nv2");
      uVar1 = error_buffer._56_4_;
      if (iVar3 == 0) {
        if (pMVar2->have_GL_ARB_vertex_program == 0) {
          builtin_strncpy(error_buffer + 0x10,"LE_NV2 profile needs GL_ARB_vertex_program",0x2b);
          error_buffer[0x3b] = SUB41(uVar1,3);
        }
        else if (pMVar2->have_GL_ARB_fragment_program == 0) {
          builtin_strncpy(error_buffer + 0x30,"ment_program",0xd);
          builtin_strncpy(error_buffer + 0x10,"LE_NV2 profile needs GL_ARB_frag",0x20);
        }
        else {
          if (pMVar2->have_GL_NV_vertex_program2_option == 0) {
            memcpy(error_buffer,"MOJOSHADER_PROFILE_NV2 profile needs GL_NV_vertex_program2_option",
                   0x42);
            return 0;
          }
          if (pMVar2->have_GL_NV_fragment_program2 != 0) {
            return 1;
          }
          builtin_strncpy(error_buffer + 0x30,"ent_program2",0xd);
          builtin_strncpy(error_buffer + 0x10,"LE_NV2 profile needs GL_NV_fragm",0x20);
        }
      }
      else {
        iVar3 = strcmp(profile,"nv3");
        if (iVar3 == 0) {
          if (pMVar2->have_GL_ARB_vertex_program == 0) {
            builtin_strncpy(error_buffer + 0x10,"LE_NV3 profile needs GL_ARB_vertex_program",0x2b);
          }
          else if (pMVar2->have_GL_ARB_fragment_program == 0) {
            builtin_strncpy(error_buffer + 0x30,"ment_program",0xd);
            builtin_strncpy(error_buffer + 0x10,"LE_NV3 profile needs GL_ARB_frag",0x20);
          }
          else if (pMVar2->have_GL_NV_vertex_program3 == 0) {
            builtin_strncpy(error_buffer + 0x10,"LE_NV3 profile needs GL_NV_vertex_program3",0x2b);
          }
          else {
            if (pMVar2->have_GL_NV_fragment_program2 != 0) {
              return 1;
            }
            builtin_strncpy(error_buffer + 0x30,"ent_program2",0xd);
            builtin_strncpy(error_buffer + 0x10,"LE_NV3 profile needs GL_NV_fragm",0x20);
          }
        }
        else {
          iVar3 = strcmp(profile,"nv4");
          if (iVar3 == 0) {
            if (pMVar2->have_GL_NV_gpu_program4 == 0) {
              builtin_strncpy(error_buffer,"MOJOSHADER_PROFILE_NV4 profile needs GL_NV_gpu_program4"
                              ,0x38);
              return 0;
            }
            return 1;
          }
          iVar3 = strcmp(profile,"glsles");
          if (iVar3 == 0) {
            if (0xffff < (int)((uint)(ushort)pMVar2->glsl_minor | pMVar2->glsl_major << 0x10)) {
              return 1;
            }
            builtin_strncpy(error_buffer + 0x30,"GLSL support",0xd);
            builtin_strncpy(error_buffer + 0x10,"LE_GLSLES profile needs missing ",0x20);
          }
          else {
            iVar3 = strcmp(profile,"glsl120");
            if (iVar3 == 0) {
              if (0x10013 < (int)((uint)(ushort)pMVar2->glsl_minor | pMVar2->glsl_major << 0x10)) {
                return 1;
              }
              builtin_strncpy(error_buffer + 0x30," GLSL support",0xe);
              builtin_strncpy(error_buffer + 0x10,"LE_GLSL120 profile needs missing",0x20);
            }
            else {
              iVar3 = strcmp(profile,"glsl");
              uVar1 = error_buffer._56_4_;
              if (iVar3 != 0) {
                builtin_strncpy(error_buffer,"unknown or unsupported profile",0x1f);
                return 0;
              }
              if (0x10009 < (int)((uint)(ushort)pMVar2->glsl_minor | pMVar2->glsl_major << 0x10)) {
                return 1;
              }
              builtin_strncpy(error_buffer + 0x10,"LE_GLSL profile needs missing GLSL support",0x2b)
              ;
              error_buffer[0x3b] = SUB41(uVar1,3);
            }
          }
        }
      }
    }
    builtin_strncpy(error_buffer,"MOJOSHADER_PROFI",0x10);
  }
  return 0;
}

Assistant:

static int valid_profile(const char *profile)
{
    if (!ctx->have_core_opengl)
        return 0;

    #define MUST_HAVE(p, x) \
        if (!ctx->have_##x) { set_error(#p " profile needs " #x); return 0; }

    // we might actually _have_ maj.min, but forcibly disabled GLSL elsewhere.
    #define MUST_HAVE_GLSL(p, maj, min) \
        if (!glsl_version_atleast(maj, min)) { \
            set_error(#p " profile needs missing GLSL support"); return 0; \
        }

    if (profile == NULL)
    {
        set_error("NULL profile");
        return 0;
    } // if

    #if SUPPORT_PROFILE_ARB1
    else if (strcmp(profile, MOJOSHADER_PROFILE_ARB1) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_ARB1, GL_ARB_vertex_program);
        MUST_HAVE(MOJOSHADER_PROFILE_ARB1, GL_ARB_fragment_program);
    } // else if
    #endif

    #if SUPPORT_PROFILE_ARB1_NV
    else if (strcmp(profile, MOJOSHADER_PROFILE_NV2) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_ARB_vertex_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_ARB_fragment_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_NV_vertex_program2_option);
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_NV_fragment_program2);
    } // else if

    else if (strcmp(profile, MOJOSHADER_PROFILE_NV3) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_ARB_vertex_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_ARB_fragment_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_NV_vertex_program3);
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_NV_fragment_program2);
    } // else if

    else if (strcmp(profile, MOJOSHADER_PROFILE_NV4) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_NV4, GL_NV_gpu_program4);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSLES
    else if (strcmp(profile, MOJOSHADER_PROFILE_GLSLES) == 0)
    {
        MUST_HAVE_GLSL(MOJOSHADER_PROFILE_GLSLES, 1, 00);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSL120
    else if (strcmp(profile, MOJOSHADER_PROFILE_GLSL120) == 0)
    {
        MUST_HAVE_GLSL(MOJOSHADER_PROFILE_GLSL120, 1, 20);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSL
    else if (strcmp(profile, MOJOSHADER_PROFILE_GLSL) == 0)
    {
        MUST_HAVE_GLSL(MOJOSHADER_PROFILE_GLSL, 1, 10);
    } // else if
    #endif

    else
    {
        set_error("unknown or unsupported profile");
        return 0;
    } // else

    #undef MUST_HAVE

    return 1;
}